

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:320:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:320:17)>
            *this)

{
  CapTableBuilder *pCVar1;
  RequestHook *pRVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_1c8;
  undefined1 local_190 [352];
  char local_30;
  Maybe<capnp::MessageSize> local_28;
  
  local_28.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_1c8,&((this->f).env)->membraned,&local_28);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send((Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
          *)local_190,(int)&local_1c8,__buf,in_RCX,in_R8D);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Pipeline::getThing
            (__return_storage_ptr__,(Pipeline *)(local_190 + 0x10));
  uVar4 = local_190._40_8_;
  uVar3 = local_190._32_8_;
  if ((char *)local_190._32_8_ != (char *)0x0) {
    local_190._32_8_ = (char *)0x0;
    local_190._40_8_ = (Disposer *)0x0;
    (***(_func_int ***)local_190._48_8_)(local_190._48_8_,uVar3,8,uVar4,uVar4,0);
  }
  uVar3 = local_190._24_8_;
  if ((WirePointer *)local_190._24_8_ != (WirePointer *)0x0) {
    local_190._24_8_ = (WirePointer *)0x0;
    (*(code *)**(undefined8 **)local_190._16_8_)
              (local_190._16_8_,
               (long)&((WireValue<uint32_t>_conflict *)uVar3)->value +
               *(long *)(*(long *)(WireValue<uint32_t>_conflict *)uVar3 + -0x10));
  }
  uVar3 = local_190._8_8_;
  if ((CapTableBuilder *)local_190._8_8_ != (CapTableBuilder *)0x0) {
    local_190._8_8_ = (CapTableBuilder *)0x0;
    (*(code *)**(undefined8 **)CONCAT71(local_190._1_7_,local_190[0]))
              ((undefined8 *)CONCAT71(local_190._1_7_,local_190[0]),
               (char *)(uVar3 + *(long *)((long)*(CapTableReader *)uVar3 + -0x10)));
  }
  pRVar2 = local_1c8.hook.ptr;
  if (local_1c8.hook.ptr != (RequestHook *)0x0) {
    local_1c8.hook.ptr = (RequestHook *)0x0;
    (**(local_1c8.hook.disposer)->_vptr_Disposer)
              (local_1c8.hook.disposer,
               pRVar2->_vptr_RequestHook[-2] + (long)&pRVar2->_vptr_RequestHook);
  }
  capnp::ClientHook::whenResolved((ClientHook *)&local_1c8);
  local_190[0] = false;
  local_30 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)&local_1c8,(ExceptionOrValue *)local_190,
                  &((this->f).env)->waitScope);
  if (local_30 == '\x01') {
    if (local_190[0] != false) {
      throwRecoverableException((Exception *)(local_190 + 8),0);
    }
  }
  else {
    if (local_190[0] == false) {
      kj::_::unreachable();
    }
    throwRecoverableException((Exception *)(local_190 + 8),0);
  }
  if (local_190[0] == true) {
    Exception::~Exception((Exception *)(local_190 + 8));
  }
  pCVar1 = local_1c8.super_Builder._builder.capTable;
  if (local_1c8.super_Builder._builder.capTable != (CapTableBuilder *)0x0) {
    local_1c8.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1c8.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_1c8.super_Builder._builder.segment,
      (pCVar1->super_CapTableReader)._vptr_CapTableReader[-2] +
      (long)&(pCVar1->super_CapTableReader)._vptr_CapTableReader);
  }
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }